

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
Add<Memory::WriteBarrierPtr<Js::PropertyRecord_const>>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *this,
          unsigned_short propertyIndex,WriteBarrierPtr<const_Js::PropertyRecord> *propertyKey,
          PropertyAttributes attributes,bool isInitialized,bool isFixed,bool usedAsFixed,
          ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  PropertyRecord *pPVar2;
  code *pcVar3;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *pPVar4;
  DynamicTypeHandler *pDVar5;
  bool bVar6;
  PropertyId propertyId;
  undefined7 in_register_00000009;
  PropertyRecord *local_70;
  PropertyRecord *local_68;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *local_60;
  undefined4 *local_58;
  uint local_4c;
  PropertyRecord *local_48;
  DynamicTypeHandler *local_40;
  SimpleDictionaryPropertyDescriptor<unsigned_short> local_34;
  
  if (propertyKey->ptr != (PropertyRecord *)0x0) {
    pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    local_34._0_1_ = (local_34._0_1_ & 0xf0) + 1;
    local_4c = (uint)CONCAT71(in_register_00000009,attributes);
    local_40 = (DynamicTypeHandler *)this;
    local_34.Attributes = attributes;
    local_34.propertyIndex = propertyIndex;
    if ((isFixed || usedAsFixed) &&
       (((uint)propertyKey->ptr->pid < 0x10 || (*(long *)(this + 0x20) == 0)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      local_58 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *local_58 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x41c,
                                  "((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr))"
                                  ,
                                  "(!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr)"
                                 );
      if (!bVar6) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *local_58 = 0;
    }
    if (((uint)propertyKey->ptr->pid < 0x10) || (propertyKey->ptr->isSymbol == true)) {
      *(byte *)&local_40[1].unusedBytes = (byte)local_40[1].unusedBytes | 4;
    }
    local_34._0_1_ =
         usedAsFixed << 3 | isFixed << 2 | isInitialized * '\x02' | local_34._0_1_ & 0xf1;
    local_48 = propertyKey->ptr;
    JsUtil::
    BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                *)local_40[1]._vptr_DynamicTypeHandler,&local_48,&local_34);
    Memory::Recycler::WBSetBit((char *)&local_60);
    local_60 = &pJVar1->typesWithNoSpecialPropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
    pPVar4 = local_60;
    pPVar2 = propertyKey->ptr;
    Memory::Recycler::WBSetBit((char *)&local_70);
    local_70 = pPVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_70);
    pPVar2 = local_70;
    Memory::Recycler::WBSetBit((char *)&local_48);
    local_48 = pPVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
    bVar6 = NoSpecialPropertyCache::IsSpecialProperty(local_48);
    if ((bVar6) &&
       (local_40->propertyTypes = local_40->propertyTypes | 0x80, (local_40->flags & 0x20) != 0)) {
      PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(pPVar4);
    }
    Memory::Recycler::WBSetBit((char *)&local_60);
    local_60 = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)
               &pJVar1->typesWithOnlyWritablePropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
    pPVar4 = local_60;
    pPVar2 = propertyKey->ptr;
    Memory::Recycler::WBSetBit((char *)&local_68);
    local_68 = pPVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_68);
    pPVar2 = local_68;
    Memory::Recycler::WBSetBit((char *)&local_48);
    local_48 = pPVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
    pDVar5 = local_40;
    if ((local_4c & 4) == 0) {
      DynamicTypeHandler::SetHasOnlyWritableDataProperties(local_40,false);
      if ((pDVar5->flags & 0x20) != 0) {
        propertyId = DynamicTypeHandler::TMapKey_GetPropertyId(scriptContext,local_48);
        ScriptContext::InvalidateStoreFieldCaches(scriptContext,propertyId);
        PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                  ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)pPVar4);
      }
    }
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Add(
        TPropertyIndex propertyIndex,
        TPropertyKey propertyKey,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();
        //
        // For a function with same named parameters,
        // property id Constants::NoProperty will be passed for all the dups except the last one
        // We need to allocate space for dups, but don't add those to map
        if (propertyKey != NULL)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyIndex, attributes);
            Assert((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr));
            if (TPropertyKey_IsInternalPropertyId(propertyKey) || TMapKey_IsSymbol(propertyKey, scriptContext))
            {
                Assert(!TMapKey_IsJavascriptString<TMapKey>());
                hasNamelessPropertyId = true;
            }
#if ENABLE_FIXED_FIELDS
            descriptor.isInitialized = isInitialized;
            descriptor.isFixed = isFixed;
            descriptor.usedAsFixed = usedAsFixed;
#endif
            propertyMap->Add(TMapKey_ConvertKey<TMapKey>(scriptContext, propertyKey), descriptor);

            library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
            library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
        }
    }